

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcCondition::~IfcCondition(IfcCondition *this)

{
  ~IfcCondition((IfcCondition *)&this[-1].super_IfcGroup.super_IfcObject.field_0x28);
  return;
}

Assistant:

IfcCondition() : Object("IfcCondition") {}